

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall
c4::yml::Tree::duplicate_children(Tree *this,Tree *src,size_t node,size_t parent,size_t after)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  size_t sVar7;
  char msg [31];
  char local_108 [8];
  undefined5 uStack_100;
  undefined2 uStack_fb;
  undefined1 uStack_f9;
  undefined5 uStack_f8;
  undefined2 uStack_f3;
  undefined1 uStack_f1;
  undefined5 uStack_f0;
  undefined2 uStack_eb;
  undefined1 uStack_e9;
  char acStack_e8 [8];
  undefined2 uStack_e0;
  undefined6 local_de;
  undefined2 uStack_d8;
  char acStack_d6 [14];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  if (src == (Tree *)0x0) {
    uStack_f8 = 0x3d21206372;
    uStack_f3 = 0x6e20;
    uStack_f1 = 0x75;
    uStack_f0 = 0x7274706c6c;
    uStack_eb = 0x29;
    builtin_strncpy(local_108,"check fa",8);
    uStack_100 = 0x3a64656c69;
    uStack_fb = 0x2820;
    uStack_f9 = 0x73;
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar1 = (code *)swi(3);
      sVar7 = (*pcVar1)();
      return sVar7;
    }
    local_50 = 0;
    uStack_48 = 0x65b9;
    local_40 = 0;
    pcStack_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x65b9) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x65b9) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_108,0x1f,LVar2,(this->m_callbacks).m_user_data);
  }
  if (node == 0xffffffffffffffff) {
    uStack_f8 = 0x212065646f;
    uStack_f3 = 0x203d;
    uStack_f1 = 0x4e;
    uStack_f0 = 0x29454e4f;
    builtin_strncpy(local_108,"check fa",8);
    uStack_100 = 0x3a64656c69;
    uStack_fb = 0x2820;
    uStack_f9 = 0x6e;
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar1 = (code *)swi(3);
      sVar7 = (*pcVar1)();
      return sVar7;
    }
    local_78 = 0;
    uStack_70 = 0x65ba;
    local_68 = 0;
    pcStack_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_58 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x65ba) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x65ba) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_108,0x1d,LVar3,(this->m_callbacks).m_user_data);
  }
  if (parent == 0xffffffffffffffff) {
    uStack_f8 = 0x746e657261;
    uStack_f3 = 0x2120;
    uStack_f1 = 0x3d;
    uStack_f0 = 0x454e4f4e20;
    uStack_eb = 0x29;
    builtin_strncpy(local_108,"check fa",8);
    uStack_100 = 0x3a64656c69;
    uStack_fb = 0x2820;
    uStack_f9 = 0x70;
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar1 = (code *)swi(3);
      sVar7 = (*pcVar1)();
      return sVar7;
    }
    local_a0 = 0;
    uStack_98 = 0x65bb;
    local_90 = 0;
    pcStack_88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_80 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x65bb) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x65bb) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_108,0x1f,LVar4,(this->m_callbacks).m_user_data);
  }
  if ((after != 0xffffffffffffffff) && (bVar6 = has_child(this,parent,after), !bVar6)) {
    uStack_d8 = 0x202c;
    builtin_strncpy(acStack_d6,"after))",8);
    builtin_strncpy(acStack_e8,"has_chil",8);
    uStack_e0 = 0x2864;
    local_de = 0x746e65726170;
    uStack_f8 = 0x2072657466;
    uStack_f3 = 0x3d3d;
    uStack_f1 = 0x20;
    uStack_f0 = 0x20454e4f4e;
    uStack_eb = 0x7c7c;
    uStack_e9 = 0x20;
    builtin_strncpy(local_108,"check fa",8);
    uStack_100 = 0x3a64656c69;
    uStack_fb = 0x2820;
    uStack_f9 = 0x61;
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar1 = (code *)swi(3);
      sVar7 = (*pcVar1)();
      return sVar7;
    }
    local_c8 = 0;
    uStack_c0 = 0x65bc;
    local_b8 = 0;
    pcStack_b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_a8 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x65bc) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x65bc) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_108,0x3a,LVar5,(this->m_callbacks).m_user_data);
  }
  for (sVar7 = first_child(src,node); sVar7 != 0xffffffffffffffff; sVar7 = next_sibling(src,sVar7))
  {
    after = duplicate(this,src,sVar7,parent,after);
  }
  return after;
}

Assistant:

size_t Tree::duplicate_children(Tree const* src, size_t node, size_t parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, parent != NONE);
    _RYML_CB_ASSERT(m_callbacks, after == NONE || has_child(parent, after));

    size_t prev = after;
    for(size_t i = src->first_child(node); i != NONE; i = src->next_sibling(i))
    {
        prev = duplicate(src, i, parent, prev);
    }

    return prev;
}